

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O1

int __thiscall asmjit::rbAssert(asmjit *this,RbNode *root)

{
  asmjit *this_00;
  asmjit *this_01;
  int iVar1;
  int iVar2;
  int extraout_EDX;
  undefined4 uVar3;
  asmjit *paVar4;
  
  uVar3 = SUB84(root,0);
  if (this == (asmjit *)0x0) {
    return 1;
  }
  this_00 = *(asmjit **)this;
  this_01 = *(asmjit **)(this + 8);
  if ((*(int *)(this + 0x18) != 0) &&
     (((this_00 != (asmjit *)0x0 && (*(int *)(this_00 + 0x18) != 0)) ||
      ((this_01 != (asmjit *)0x0 && (*(int *)(this_01 + 0x18) != 0)))))) goto LAB_00118eb3;
  iVar1 = rbAssert(this_00,root);
  uVar3 = SUB84(root,0);
  paVar4 = this_01;
  iVar2 = rbAssert(this_01,root);
  if ((this_00 == (asmjit *)0x0) || (*(ulong *)(this_00 + 0x10) < *(ulong *)(this + 0x10))) {
    if ((this_01 == (asmjit *)0x0) || (*(ulong *)(this + 0x10) < *(ulong *)(this_01 + 0x10))) {
      if (iVar1 == iVar2 || (iVar2 == 0 || iVar1 == 0)) {
        if (iVar2 == 0 || iVar1 == 0) {
          return 0;
        }
        return iVar1 + (uint)(*(int *)(this + 0x18) == 0);
      }
      rbAssert();
      goto LAB_00118ea9;
    }
  }
  else {
LAB_00118ea9:
    rbAssert();
  }
  this = paVar4;
  rbAssert();
LAB_00118eb3:
  rbAssert();
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined1 **)(this + 0x10) = Zone_zeroBlock;
  *(undefined4 *)(this + 0x18) = uVar3;
  iVar1 = 0;
  if (extraout_EDX < 0x10) {
    if (extraout_EDX == 2) {
      iVar1 = 1;
    }
    else if (extraout_EDX == 4) {
      iVar1 = 2;
    }
    else if (extraout_EDX == 8) {
      iVar1 = 3;
    }
  }
  else if (extraout_EDX == 0x10) {
    iVar1 = 4;
  }
  else if (extraout_EDX == 0x20) {
    iVar1 = 5;
  }
  else if (extraout_EDX == 0x40) {
    iVar1 = 6;
  }
  *(int *)(this + 0x1c) = iVar1;
  return iVar1;
}

Assistant:

static int rbAssert(RbNode* root) noexcept {
  if (!root) return 1;

  RbNode* ln = root->node[0];
  RbNode* rn = root->node[1];

  // Red violation.
  ASMJIT_ASSERT(!(rbIsRed(root) && (rbIsRed(ln) || rbIsRed(rn))));

  int lh = rbAssert(ln);
  int rh = rbAssert(rn);

  // Invalid btree.
  ASMJIT_ASSERT(ln == nullptr || ln->mem < root->mem);
  ASMJIT_ASSERT(rn == nullptr || rn->mem > root->mem);

  // Black violation.
  ASMJIT_ASSERT(!(lh != 0 && rh != 0 && lh != rh));

  // Only count black links.
  if (lh != 0 && rh != 0)
    return rbIsRed(root) ? lh : lh + 1;
  else
    return 0;
}